

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O3

bool __thiscall S2Loop::ContainsNested(S2Loop *this,S2Loop *b)

{
  bool bVar1;
  int iVar2;
  S2Point *pSVar3;
  S2Point *ab1;
  S2Point *a2;
  S2Point *b0;
  S2Point *b2;
  
  bVar1 = S2LatLngRect::Contains(&this->subregion_bound_,&b->bound_);
  if (bVar1) {
    if (this->num_vertices_ == 1) {
      if ((this->origin_inside_ & 1U) != 0) {
        return true;
      }
      iVar2 = b->num_vertices_;
    }
    else {
      iVar2 = b->num_vertices_;
      if (1 < iVar2) {
        pSVar3 = vertex(b,1);
        iVar2 = FindVertex(this,pSVar3);
        if (iVar2 < 0) {
          pSVar3 = vertex(b,1);
          bVar1 = Contains(this,pSVar3);
          return bVar1;
        }
        pSVar3 = vertex(this,iVar2 + -1);
        ab1 = vertex(this,iVar2);
        a2 = vertex(this,iVar2 + 1);
        b0 = vertex(b,0);
        b2 = vertex(b,2);
        bVar1 = S2::WedgeContains(pSVar3,ab1,a2,b0,b2);
        return bVar1;
      }
    }
    bVar1 = (bool)((b->origin_inside_ ^ 1U) & iVar2 == 1);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool S2Loop::ContainsNested(const S2Loop* b) const {
  if (!subregion_bound_.Contains(b->bound_)) return false;

  // Special cases to handle either loop being empty or full.  Also bail out
  // when B has no vertices to avoid heap overflow on the vertex(1) call
  // below.  (This method is called during polygon initialization before the
  // client has an opportunity to call IsValid().)
  if (is_empty_or_full() || b->num_vertices() < 2) {
    return is_full() || b->is_empty();
  }

  // We are given that A and B do not share any edges, and that either one
  // loop contains the other or they do not intersect.
  int m = FindVertex(b->vertex(1));
  if (m < 0) {
    // Since b->vertex(1) is not shared, we can check whether A contains it.
    return Contains(b->vertex(1));
  }
  // Check whether the edge order around b->vertex(1) is compatible with
  // A containing B.
  return S2::WedgeContains(vertex(m-1), vertex(m), vertex(m+1),
                                   b->vertex(0), b->vertex(2));
}